

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  int iVar1;
  uint uVar2;
  ulong numpixels_00;
  size_t sVar3;
  LodePNGColorMode *in_RCX;
  LodePNGColorMode *in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  int in_R8D;
  int in_R9D;
  uint error;
  uchar a_1;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *p;
  size_t palsize;
  uchar *palette;
  size_t palettesize;
  size_t numbytes;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  undefined8 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  LodePNGColorMode *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint uVar4;
  unsigned_short in_stack_ffffffffffffff08;
  unsigned_short a_00;
  unsigned_short in_stack_ffffffffffffff0a;
  unsigned_short b_00;
  unsigned_short in_stack_ffffffffffffff0c;
  unsigned_short g_00;
  uchar in_stack_ffffffffffffff0e;
  undefined1 uVar5;
  uchar in_stack_ffffffffffffff0f;
  undefined1 uVar6;
  ColorTree *in_stack_ffffffffffffff10;
  LodePNGColorMode *in_stack_ffffffffffffff18;
  LodePNGColorMode *in_stack_ffffffffffffff20;
  LodePNGColorMode *in_stack_ffffffffffffff28;
  uchar *in_stack_ffffffffffffff30;
  uchar in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff41;
  uchar in_stack_ffffffffffffff48;
  LodePNGColorMode *local_38;
  
  numpixels_00 = (ulong)(uint)(in_R8D * in_R9D);
  iVar1 = lodepng_color_mode_equal(in_RDX,in_RCX);
  if (iVar1 == 0) {
    if (in_RDX->colortype == LCT_PALETTE) {
      in_stack_ffffffffffffff28 = (LodePNGColorMode *)in_RDX->palettesize;
      in_stack_ffffffffffffff20 = (LodePNGColorMode *)in_RDX->palette;
      in_stack_ffffffffffffff18 =
           (LodePNGColorMode *)(ulong)(uint)(1 << ((byte)in_RDX->bitdepth & 0x1f));
      if (in_stack_ffffffffffffff28 == (LodePNGColorMode *)0x0) {
        in_stack_ffffffffffffff28 = (LodePNGColorMode *)in_RCX->palettesize;
        in_stack_ffffffffffffff20 = (LodePNGColorMode *)in_RCX->palette;
      }
      if (in_stack_ffffffffffffff28 < in_stack_ffffffffffffff18) {
        in_stack_ffffffffffffff18 = in_stack_ffffffffffffff28;
      }
      color_tree_init((ColorTree *)&stack0xffffffffffffff40);
      for (local_38 = (LodePNGColorMode *)0x0; local_38 != in_stack_ffffffffffffff18;
          local_38 = (LodePNGColorMode *)((long)&local_38->colortype + 1)) {
        in_stack_ffffffffffffff10 =
             (ColorTree *)(&in_stack_ffffffffffffff20->colortype + (long)local_38);
        color_tree_add((ColorTree *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (uchar)((ulong)in_stack_fffffffffffffee8 >> 0x38),
                       (uchar)((ulong)in_stack_fffffffffffffee8 >> 0x30),
                       (uchar)((ulong)in_stack_fffffffffffffee8 >> 0x28),
                       (uchar)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                       (uint)in_stack_fffffffffffffee8);
      }
    }
    if ((in_RCX->bitdepth == 0x10) && (in_RDX->bitdepth == 0x10)) {
      for (local_38 = (LodePNGColorMode *)0x0; local_38 != (LodePNGColorMode *)numpixels_00;
          local_38 = (LodePNGColorMode *)((long)local_38 + 1)) {
        uVar5 = 0;
        uVar6 = 0;
        g_00 = 0;
        b_00 = 0;
        a_00 = 0;
        getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff0e,
                            (unsigned_short *)&stack0xffffffffffffff0c,
                            (unsigned_short *)&stack0xffffffffffffff0a,
                            (unsigned_short *)&stack0xffffffffffffff08,in_RSI,(size_t)local_38,
                            in_RCX);
        rgba16ToPixel(in_RDI,(size_t)local_38,in_RDX,CONCAT11(uVar6,uVar5),g_00,b_00,a_00);
      }
    }
    else {
      uVar4 = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      if ((in_RDX->bitdepth == 8) && (in_RDX->colortype == LCT_RGBA)) {
        getPixelColorsRGBA8((uchar *)CONCAT71(in_stack_ffffffffffffff41,in_stack_ffffffffffffff40),
                            numpixels_00,uVar4,(uchar *)in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff20);
      }
      else if ((in_RDX->bitdepth == 8) && (in_RDX->colortype == LCT_RGB)) {
        getPixelColorsRGBA8((uchar *)CONCAT71(in_stack_ffffffffffffff41,in_stack_ffffffffffffff40),
                            numpixels_00,uVar4,(uchar *)in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff20);
      }
      else {
        uVar4 = 0;
        for (local_38 = (LodePNGColorMode *)0x0; local_38 != (LodePNGColorMode *)numpixels_00;
            local_38 = (LodePNGColorMode *)((long)local_38 + 1)) {
          getPixelColorRGBA8(in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28,
                             (uchar *)in_stack_ffffffffffffff20,(uchar *)in_stack_ffffffffffffff18,
                             (uchar *)in_stack_ffffffffffffff10,
                             CONCAT17(in_stack_ffffffffffffff0f,
                                      CONCAT16(in_stack_ffffffffffffff0e,
                                               CONCAT24(in_stack_ffffffffffffff0c,
                                                        CONCAT22(in_stack_ffffffffffffff0a,
                                                                 in_stack_ffffffffffffff08)))),
                             (LodePNGColorMode *)
                             CONCAT71(in_stack_ffffffffffffff41,in_stack_ffffffffffffff40));
          in_stack_fffffffffffffef0 = uVar4 & 0xff;
          uVar2 = rgba8ToPixel((uchar *)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                               in_stack_ffffffffffffff0f,in_stack_ffffffffffffff0e,
                               in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
          if (uVar2 != 0) {
            return uVar2;
          }
        }
      }
    }
    if (in_RDX->colortype == LCT_PALETTE) {
      color_tree_cleanup((ColorTree *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
      ;
    }
  }
  else {
    sVar3 = lodepng_get_raw_size
                      (in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                      );
    for (local_38 = (LodePNGColorMode *)0x0; local_38 != (LodePNGColorMode *)sVar3;
        local_38 = (LodePNGColorMode *)((long)local_38 + 1)) {
      in_RDI[(long)local_38] = in_RSI[(long)local_38];
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}